

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultExtendsClauseArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultExtendsClauseArgSyntax,slang::syntax::DefaultExtendsClauseArgSyntax_const&>
          (BumpAllocator *this,DefaultExtendsClauseArgSyntax *args)

{
  undefined4 uVar1;
  DefaultExtendsClauseArgSyntax *pDVar2;
  long lVar3;
  DefaultExtendsClauseArgSyntax *pDVar4;
  byte bVar5;
  
  bVar5 = 0;
  pDVar2 = (DefaultExtendsClauseArgSyntax *)allocate(this,0x48,8);
  pDVar4 = pDVar2;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
    (pDVar4->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
    *(undefined4 *)&(pDVar4->super_SyntaxNode).field_0x4 = uVar1;
    args = (DefaultExtendsClauseArgSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pDVar4 = (DefaultExtendsClauseArgSyntax *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }